

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effects.c
# Opt level: O0

_Bool effect_do(effect *effect,source origin,object *obj,_Bool *ident,_Bool aware,wchar_t dir,
               wchar_t beam,wchar_t boost,command_conflict *cmd)

{
  _Bool _Var1;
  wchar_t wVar2;
  _Bool local_da;
  undefined1 local_d8 [8];
  effect_handler_context_t context;
  int local_60;
  wchar_t choice;
  wchar_t leftover;
  wchar_t choice_count;
  random_value_conflict value;
  effect_handler_f handler;
  _Bool completed;
  _Bool aware_local;
  _Bool *ident_local;
  object *obj_local;
  effect *effect_local;
  source origin_local;
  
  handler._6_1_ = false;
  memset(&leftover,0,0x10);
  obj_local = (object *)effect;
  do {
    choice = L'\0';
    local_60 = 1;
    _Var1 = effect_valid((effect *)obj_local);
    if (!_Var1) {
      msg("Bad effect passed to effect_do(). Please report this bug.");
      return false;
    }
    if (obj_local->artifact != (artifact *)0x0) {
      choice = dice_roll((dice_t *)obj_local->artifact,(random_value *)&leftover);
    }
    if ((*(short *)&obj_local->ego == 1) || (*(short *)&obj_local->ego == 0x6c)) {
      if (L'\0' < choice) {
        if (((*(short *)&obj_local->ego == 1) || (origin.what != SRC_PLAYER)) || (choice < L'\x02'))
        {
          context.cmd._4_4_ = Rand_div(choice);
        }
        else {
          if (*(short *)&obj_local->ego != 0x6c) {
            __assert_fail("effect->index == EF_SELECT && origin.what == SRC_PLAYER",
                          "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/effects.c"
                          ,0x1af,
                          "_Bool effect_do(struct effect *, struct source, struct object *, _Bool *, _Bool, int, int, int, struct command *)"
                         );
          }
          *ident = true;
          if (cmd == (command_conflict *)0x0) {
            context.cmd._4_4_ =
                 get_effect_from_list((char *)0x0,(effect *)obj_local->kind,choice,true);
            if (context.cmd._4_4_ == L'\xffffffff') {
              return false;
            }
          }
          else {
            wVar2 = cmd_get_effect_from_list
                              ((command *)cmd,"list_index",(int *)((long)&context.cmd + 4),
                               (char *)0x0,(effect *)obj_local->kind,choice,true);
            if (wVar2 != L'\0') {
              return false;
            }
          }
          if (context.cmd._4_4_ == L'\xfffffffe') {
            context.cmd._4_4_ = Rand_div(choice);
          }
          if ((context.cmd._4_4_ < L'\0') || (choice <= context.cmd._4_4_)) {
            __assert_fail("choice >= 0 && choice < choice_count",
                          "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/effects.c"
                          ,0x1cc,
                          "_Bool effect_do(struct effect *, struct source, struct object *, _Bool *, _Bool, int, int, int, struct command *)"
                         );
          }
        }
        local_60 = choice - context.cmd._4_4_;
        for (obj_local = (object *)obj_local->kind; wVar2 = context.cmd._4_4_ + L'\xffffffff',
            context.cmd._4_4_ != L'\0' && obj_local != (object *)0x0;
            obj_local = (object *)obj_local->kind) {
          context.cmd._4_4_ = wVar2;
        }
        if (obj_local == (object *)0x0) {
          return true;
        }
        context.cmd._4_4_ = wVar2;
        if (obj_local->artifact != (artifact *)0x0) {
          dice_roll((dice_t *)obj_local->artifact,(random_value *)&leftover);
        }
        goto LAB_00155627;
      }
      handler._6_1_ = true;
      obj_local = (object *)obj_local->kind;
    }
    else {
LAB_00155627:
      value._8_8_ = effects[*(ushort *)&obj_local->ego].handler;
      if ((effect_handler_f)value._8_8_ != (effect_handler_f)0x0) {
        local_d8._0_4_ = ZEXT24(*(ushort *)&obj_local->ego);
        context._4_4_ = effect_local._4_4_;
        context.effect = origin.what;
        context.obj._4_4_ = dir;
        context._32_4_ = beam;
        context.dir = boost;
        context.beam = leftover;
        context.boost = choice_count;
        context.value.base = value.base;
        context.value.dice = value.dice;
        context.value.sides = *(wchar_t *)&obj_local->next;
        context.value.m_bonus = *(wchar_t *)((long)&obj_local->next + 4);
        context.subtype = *(wchar_t *)&obj_local->known;
        context.radius = *(wchar_t *)&obj_local->prev;
        context.other = *(wchar_t *)((long)&obj_local->prev + 4);
        context._80_8_ = *(undefined8 *)&obj_local->oidx;
        context.msg._0_1_ = *ident & 1;
        context._96_8_ = cmd;
        context.origin._0_8_ = origin.which;
        context.origin.which.object = obj;
        context.obj._0_1_ = aware;
        _Var1 = (*(code *)value._8_8_)((effect_handler_context_t *)local_d8);
        local_da = true;
        if (!_Var1) {
          local_da = handler._6_1_;
        }
        handler._6_1_ = local_da;
        *ident = (_Bool)((byte)context.msg & 1);
      }
      for (; local_60 != 0 && obj_local != (object *)0x0; obj_local = (object *)obj_local->kind) {
        local_60 = local_60 + -1;
      }
    }
    if (obj_local == (object *)0x0) {
      return handler._6_1_;
    }
  } while( true );
}

Assistant:

bool effect_do(struct effect *effect,
		struct source origin,
		struct object *obj,
		bool *ident,
		bool aware,
		int dir,
		int beam,
		int boost,
		struct command *cmd)
{
	bool completed = false;
	effect_handler_f handler;
	random_value value = { 0, 0, 0, 0 };

	do {
		int choice_count = 0, leftover = 1;

		if (!effect_valid(effect)) {
			msg("Bad effect passed to effect_do(). Please report this bug.");
			return false;
		}

		if (effect->dice != NULL)
			choice_count = dice_roll(effect->dice, &value);

		/* Deal with special random and select effects */
		if (effect->index == EF_RANDOM || effect->index == EF_SELECT) {
			int choice;

			/*
			 * If it has no subeffects, act as if it completed
			 * successfully and go to the next effect.
			 */
			if (choice_count <= 0) {
				completed = true;
				effect = effect->next;
				continue;
			}

			/*
			 * Treat select effects like random ones if they
			 * aren't from a player or if there's really no choice
			 * to be made.
			 */
			if (effect->index == EF_RANDOM ||
					origin.what != SRC_PLAYER ||
					choice_count < 2) {
				choice = randint0(choice_count);
			} else {
				assert(effect->index == EF_SELECT &&
					origin.what == SRC_PLAYER);
				/*
				 * Since a choice is presented, allow
				 * identification, even if no choice is made.
				 */
				*ident = true;
				if (cmd) {
					if (cmd_get_effect_from_list(cmd,
							"list_index",
							&choice, NULL,
							effect->next,
							choice_count,
							true) != CMD_OK) {
						return false;
					}
				} else {
					choice = get_effect_from_list(NULL,
						effect->next, choice_count,
						true);
					if (choice == -1) return false;
				}

				/*
				 * If the player chose to use a random effect,
				 * roll for it.
				 */
				if (choice == -2) {
					choice = randint0(choice_count);
				}
				assert(choice >= 0 && choice < choice_count);
			}

			leftover = choice_count - choice;

			/* Skip to the chosen effect */
			effect = effect->next;
			while (choice-- && effect)
				effect = effect->next;
			if (!effect) {
				/*
				 * There's fewer subeffects than expected.  Act
				 * as if it ran successfully.
				 */
				completed = true;
				break;
			}

			/* Roll the damage, if needed */
			if (effect->dice != NULL)
				(void) dice_roll(effect->dice, &value);
		}

		/* Handle the effect */
		handler = effects[effect->index].handler;
		if (handler != NULL) {
			effect_handler_context_t context = {
				effect->index,
				origin,
				obj,
				aware,
				dir,
				beam,
				boost,
				value,
				effect->subtype,
				effect->radius,
				effect->other,
				effect->y,
				effect->x,
				effect->msg,
				*ident,
				cmd
			};

			completed = handler(&context) || completed;
			*ident = context.ident;
		}

		/* Get the next effect, if there is one */
		while (leftover-- && effect)
			effect = effect->next;
	} while (effect);

	return completed;
}